

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O0

uint __thiscall
Assimp::SpatialSort::GenerateMappingTable
          (SpatialSort *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *fill,
          ai_real pRadius)

{
  uint uVar1;
  bool bVar2;
  aiVector3D *paVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  aiVector3D *paVar6;
  const_reference pvVar7;
  reference pvVar8;
  float fVar9;
  aiVector3t<float> aVar10;
  ulong local_68;
  size_t i_1;
  float local_58;
  aiVector3t<float> local_4c;
  aiVector3t<float> *local_40;
  aiVector3D *oldpos;
  size_t i;
  ai_real pSquared;
  uint t;
  ai_real maxDist;
  ai_real dist;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  ai_real pRadius_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *fill_local;
  SpatialSort *this_local;
  
  dist = pRadius;
  pvStack_18 = fill;
  fill_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  sVar5 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::size
                    (&this->mPositions);
  maxDist = -NAN;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (fill,sVar5,(value_type_conflict1 *)&maxDist);
  i._4_4_ = 0;
  i._0_4_ = dist * dist;
  oldpos = (aiVector3D *)0x0;
  while( true ) {
    paVar3 = oldpos;
    paVar6 = (aiVector3D *)
             std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
             size(&this->mPositions);
    if (paVar6 <= paVar3) break;
    pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
             operator[](&this->mPositions,(size_type)oldpos);
    t = (uint)::operator*(&pvVar7->mPosition,&this->mPlaneNormal);
    pvVar4 = pvStack_18;
    uVar1 = i._4_4_;
    pSquared = (float)t + dist;
    pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
             operator[](&this->mPositions,(size_type)oldpos);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvVar4,(ulong)pvVar7->mIndex);
    *pvVar8 = uVar1;
    pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
             operator[](&this->mPositions,(size_type)oldpos);
    local_40 = &pvVar7->mPosition;
    while( true ) {
      oldpos = (aiVector3D *)((long)&oldpos->x + 1);
      paVar3 = oldpos;
      paVar6 = (aiVector3D *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_18);
      bVar2 = false;
      if (paVar3 < paVar6) {
        pvVar7 = std::
                 vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
                 operator[](&this->mPositions,(size_type)oldpos);
        bVar2 = false;
        if (pvVar7->mDistance < pSquared) {
          pvVar7 = std::
                   vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
                   operator[](&this->mPositions,(size_type)oldpos);
          aVar10 = ::operator-(&pvVar7->mPosition,local_40);
          i_1 = aVar10._0_8_;
          local_4c.x = (float)(undefined4)i_1;
          local_4c.y = (float)i_1._4_4_;
          local_58 = aVar10.z;
          local_4c.z = local_58;
          fVar9 = aiVector3t<float>::SquareLength(&local_4c);
          bVar2 = fVar9 < (float)i;
        }
      }
      pvVar4 = pvStack_18;
      uVar1 = i._4_4_;
      if (!bVar2) break;
      pvVar7 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ::operator[](&this->mPositions,(size_type)oldpos);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar4,(ulong)pvVar7->mIndex);
      *pvVar8 = uVar1;
    }
    i._4_4_ = i._4_4_ + 1;
  }
  local_68 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_18);
    if (sVar5 <= local_68) {
      return i._4_4_;
    }
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvStack_18,local_68);
    uVar1 = *pvVar8;
    sVar5 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
            size(&this->mPositions);
    if (sVar5 <= uVar1) break;
    local_68 = local_68 + 1;
  }
  __assert_fail("fill[i]<mPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SpatialSort.cpp"
                ,0x151,
                "unsigned int Assimp::SpatialSort::GenerateMappingTable(std::vector<unsigned int> &, ai_real) const"
               );
}

Assistant:

unsigned int SpatialSort::GenerateMappingTable(std::vector<unsigned int>& fill, ai_real pRadius) const
{
    fill.resize(mPositions.size(),UINT_MAX);
    ai_real dist, maxDist;

    unsigned int t=0;
    const ai_real pSquared = pRadius*pRadius;
    for (size_t i = 0; i < mPositions.size();) {
        dist = mPositions[i].mPosition * mPlaneNormal;
        maxDist = dist + pRadius;

        fill[mPositions[i].mIndex] = t;
        const aiVector3D& oldpos = mPositions[i].mPosition;
        for (++i; i < fill.size() && mPositions[i].mDistance < maxDist
            && (mPositions[i].mPosition - oldpos).SquareLength() < pSquared; ++i)
        {
            fill[mPositions[i].mIndex] = t;
        }
        ++t;
    }

#ifdef ASSIMP_BUILD_DEBUG

    // debug invariant: mPositions[i].mIndex values must range from 0 to mPositions.size()-1
    for (size_t i = 0; i < fill.size(); ++i) {
        ai_assert(fill[i]<mPositions.size());
    }

#endif
    return t;
}